

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O2

bool Config::parse(int argc,char **argv,List<Path> *rcFiles)

{
  ulong uVar1;
  pointer this;
  pointer ppOVar2;
  pointer ppOVar3;
  option *poVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  const_reference pvVar8;
  FILE *__stream;
  reference pvVar9;
  reference ppOVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  bool *ok_00;
  OptionBase *pOVar14;
  char *pcVar15;
  size_t i;
  ulong uVar16;
  size_t i_1;
  bool ok;
  int idx;
  List<String> args;
  List<String> split;
  List<Config::OptionBase_*> optionPointers;
  List<Value> vals;
  String error;
  String shortOpts;
  Value local_1490;
  StackBuffer<128UL,_char_*> a;
  StackBuffer<128UL,_option> options;
  
  error.mString._M_dataplus._M_p = (pointer)&error.mString.field_2;
  error.mString._M_string_length = 0;
  error.mString.field_2._M_local_buf[0] = '\0';
  Rct::findExecutablePath(*argv);
  args.super_vector<String,_std::allocator<String>_>.
  super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  args.super_vector<String,_std::allocator<String>_>.
  super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  args.super_vector<String,_std::allocator<String>_>.
  super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  String::String((String *)&options,*argv,0xffffffffffffffff);
  std::vector<String,_std::allocator<String>_>::push_back
            (&args.super_vector<String,_std::allocator<String>_>,(value_type *)&options);
  std::__cxx11::string::~string((string *)&options);
  lVar13 = 1;
  for (uVar16 = 0;
      uVar16 < (ulong)((long)(rcFiles->super_vector<Path,_std::allocator<Path>_>).
                             super__Vector_base<Path,_std::allocator<Path>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(rcFiles->super_vector<Path,_std::allocator<Path>_>).
                             super__Vector_base<Path,_std::allocator<Path>_>._M_impl.
                             super__Vector_impl_data._M_start >> 5); uVar16 = uVar16 + 1) {
    pvVar8 = std::vector<Path,_std::allocator<Path>_>::at
                       (&rcFiles->super_vector<Path,_std::allocator<Path>_>,uVar16);
    __stream = fopen((pvVar8->super_String).mString._M_dataplus._M_p,"r");
    if (__stream != (FILE *)0x0) {
      while (iVar7 = Rct::readLine((FILE *)__stream,(char *)&options,0x400), iVar7 != -1) {
        pcVar15 = (char *)((long)&a.mSize + 7);
        do {
          cVar5 = pcVar15[1];
          pcVar15 = pcVar15 + 1;
          iVar7 = isspace((int)cVar5);
        } while (iVar7 != 0);
        if (cVar5 != '#') {
          String::String((String *)&a,pcVar15,0xffffffffffffffff);
          String::split(&split,(String *)&a,' ',0);
          std::__cxx11::string::~string((string *)&a);
          this = split.super_vector<String,_std::allocator<String>_>.
                 super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data
                 ._M_start;
          if (split.super_vector<String,_std::allocator<String>_>.
              super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
              _M_start !=
              (pointer)CONCAT71(split.super_vector<String,_std::allocator<String>_>.
                                super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                super__Vector_impl_data._M_finish._1_7_,
                                split.super_vector<String,_std::allocator<String>_>.
                                super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_1_)) {
            uVar1 = ((split.super_vector<String,_std::allocator<String>_>.
                      super__Vector_base<String,_std::allocator<String>_>._M_impl.
                      super__Vector_impl_data._M_start)->mString)._M_string_length;
            if ((uVar1 == 1) ||
               ((2 < uVar1 &&
                (cVar5 = String::at(split.super_vector<String,_std::allocator<String>_>.
                                    super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                    super__Vector_impl_data._M_start,1), cVar5 == '=')))) {
              String::prepend(this,'-');
            }
            else {
              String::String((String *)&a,"--",0xffffffffffffffff);
              String::prepend(this,(String *)&a);
              std::__cxx11::string::~string((string *)&a);
            }
            List<String>::append(&args,&split);
          }
          std::vector<String,_std::allocator<String>_>::~vector
                    (&split.super_vector<String,_std::allocator<String>_>);
        }
      }
      fclose(__stream);
    }
  }
  for (; lVar13 < argc; lVar13 = lVar13 + 1) {
    String::String((String *)&options,argv[lVar13],0xffffffffffffffff);
    std::vector<String,_std::allocator<String>_>::emplace_back<String>
              (&args.super_vector<String,_std::allocator<String>_>,(String *)&options);
    std::__cxx11::string::~string((string *)&options);
  }
  StackBuffer<128UL,_char_*>::StackBuffer
            (&a,(long)args.super_vector<String,_std::allocator<String>_>.
                      super__Vector_base<String,_std::allocator<String>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)args.super_vector<String,_std::allocator<String>_>.
                      super__Vector_base<String,_std::allocator<String>_>._M_impl.
                      super__Vector_impl_data._M_start >> 5);
  lVar13 = 0;
  for (uVar16 = 0;
      uVar16 < (ulong)((long)args.super_vector<String,_std::allocator<String>_>.
                             super__Vector_base<String,_std::allocator<String>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)args.super_vector<String,_std::allocator<String>_>.
                             super__Vector_base<String,_std::allocator<String>_>._M_impl.
                             super__Vector_impl_data._M_start >> 5); uVar16 = uVar16 + 1) {
    pvVar9 = std::vector<String,_std::allocator<String>_>::at
                       (&args.super_vector<String,_std::allocator<String>_>,uVar16);
    pcVar15 = strdup((pvVar9->mString)._M_dataplus._M_p);
    *(char **)((long)a.mBuffer + (lVar13 >> 0x1d)) = pcVar15;
    lVar13 = lVar13 + 0x100000000;
  }
  StackBuffer<128UL,_option>::StackBuffer
            (&options,((long)sOptions.
                             super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             .
                             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)sOptions.
                             super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             .
                             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
  optionPointers.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  optionPointers.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  optionPointers.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (uVar16 = 0;
      uVar16 < (ulong)((long)sOptions.
                             super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             .
                             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)sOptions.
                             super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             .
                             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar16 = uVar16 + 1) {
    ppOVar10 = std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::at
                         (&sOptions.
                           super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                          ,uVar16);
    poVar4 = options.mBuffer;
    ppOVar3 = optionPointers.
              super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    ppOVar2 = optionPointers.
              super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    split.super_vector<String,_std::allocator<String>_>.
    super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)*ppOVar10;
    if (*(long *)((long)split.super_vector<String,_std::allocator<String>_>.
                        super__Vector_base<String,_std::allocator<String>_>._M_impl.
                        super__Vector_impl_data._M_start + 8) != 0) {
      std::vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::push_back
                (&optionPointers.
                  super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>,
                 (value_type *)&split);
      iVar7 = (int)((ulong)((long)ppOVar3 - (long)ppOVar2) >> 3);
      poVar4[iVar7].name =
           (char *)((split.super_vector<String,_std::allocator<String>_>.
                     super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_start)->mString)._M_string_length;
      poVar4[iVar7].has_arg =
           (uint)(*(int *)((long)&split.super_vector<String,_std::allocator<String>_>.
                                  super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                  super__Vector_impl_data._M_start[1].mString.field_2 + 8) != 2);
      poVar4[iVar7].val =
           (int)((split.super_vector<String,_std::allocator<String>_>.
                  super__Vector_base<String,_std::allocator<String>_>._M_impl.
                  super__Vector_impl_data._M_start)->mString).field_2._M_local_buf[0];
      poVar4[iVar7].flag = (int *)0x0;
    }
  }
  iVar7 = (int)((ulong)((long)optionPointers.
                              super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                              .
                              super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)optionPointers.
                             super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             .
                             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  options.mBuffer[iVar7].flag = (int *)0x0;
  (&options.mBuffer[iVar7].flag)[1] = (int *)0x0;
  options.mBuffer[iVar7].name = (char *)0x0;
  *(undefined8 *)&options.mBuffer[iVar7].has_arg = 0;
  Rct::shortOptions(&shortOpts,options.mBuffer);
  ok_00 = &ok;
  ok = true;
  do {
    idx = -1;
    iVar7 = getopt_long((ulong)((long)args.super_vector<String,_std::allocator<String>_>.
                                      super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)args.super_vector<String,_std::allocator<String>_>.
                                     super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 5,a.mBuffer,
                        shortOpts.mString._M_dataplus._M_p,options.mBuffer,&idx);
    if (iVar7 == -1) goto LAB_00162422;
    if (iVar7 == 0x3f) {
LAB_001623d7:
      ok = false;
      goto LAB_00162422;
    }
    if ((long)idx == -1) {
      lVar13 = 0;
      do {
        if ((long)optionPointers.
                  super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)optionPointers.
                  super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3 == lVar13) goto LAB_001623d7;
        pOVar14 = optionPointers.
                  super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar13];
        lVar13 = lVar13 + 1;
      } while (iVar7 != (char)pOVar14[0x10]);
    }
    else {
      pOVar14 = optionPointers.
                super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                _M_impl.super__Vector_impl_data._M_start[idx];
      if (pOVar14 == (OptionBase *)0x0) goto LAB_001623d7;
    }
    *(long *)(pOVar14 + 0xb0) = *(long *)(pOVar14 + 0xb0) + 1;
    pcVar15 = _optarg;
    if (_optarg == (char *)0x0) {
      if (*(int *)(pOVar14 + 0x38) != 2) {
        __assert_fail("opt->defaultValue.type() == Value::Type_Boolean",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Config.cpp"
                      ,0x99,"static bool Config::parse(int, char **, const List<Path> &)");
      }
      bVar6 = Value::toBool((Value *)(pOVar14 + 0x38));
      split.super_vector<String,_std::allocator<String>_>.
      super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_finish.
      _0_1_ = !bVar6;
      split.super_vector<String,_std::allocator<String>_>.
      super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(split.super_vector<String,_std::allocator<String>_>.
                             super__Vector_base<String,_std::allocator<String>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,2);
      Value::operator=((Value *)(pOVar14 + 0x70),(Value *)&split);
      Value::~Value((Value *)&split);
LAB_001623b6:
      iVar7 = 0;
    }
    else {
      split.super_vector<String,_std::allocator<String>_>.
      super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)((ulong)split.super_vector<String,_std::allocator<String>_>.
                            super__Vector_base<String,_std::allocator<String>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
      if (*_optarg == '=') {
        iVar7 = strcmp(a.mBuffer[(long)_optind + -1],_optarg);
        pcVar15 = pcVar15 + (iVar7 != 0);
      }
      createValue(&local_1490,*(Type *)(pOVar14 + 0xa8),pcVar15,ok_00);
      Value::operator=((Value *)&split,&local_1490);
      Value::~Value(&local_1490);
      if (ok == false) {
        pcVar12 = Value::typeToString(*(Type *)(pOVar14 + 0xa8));
        String::format<128ul>
                  ((String *)&local_1490,"\"%s\" can not be converted to \"%s\" for %s",pcVar15,
                   pcVar12,*(long *)(pOVar14 + 8));
        std::__cxx11::string::operator=((string *)&error,(string *)&local_1490);
        std::__cxx11::string::~string((string *)&local_1490);
LAB_001623a3:
        iVar7 = 0x15;
      }
      else if (*(int *)(pOVar14 + 0x38) == 8) {
        vals.super_vector<Value,_std::allocator<Value>_>.
        super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vals.super_vector<Value,_std::allocator<Value>_>.
        super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        vals.super_vector<Value,_std::allocator<Value>_>.
        super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Value,_std::allocator<Value>_>::push_back
                  (&vals.super_vector<Value,_std::allocator<Value>_>,(value_type *)&split);
        while ((((ulong)(long)_optind <
                 (ulong)((long)args.super_vector<String,_std::allocator<String>_>.
                               super__Vector_base<String,_std::allocator<String>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)args.super_vector<String,_std::allocator<String>_>.
                               super__Vector_base<String,_std::allocator<String>_>._M_impl.
                               super__Vector_impl_data._M_start >> 5) &&
                (*a.mBuffer[_optind] != '-')) &&
               ((*(ulong *)(pOVar14 + 0xb8) == 0 ||
                ((ulong)(((long)vals.super_vector<Value,_std::allocator<Value>_>.
                                super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)vals.super_vector<Value,_std::allocator<Value>_>.
                               super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x38) <
                 *(ulong *)(pOVar14 + 0xb8)))))) {
          createValue(&local_1490,*(Type *)(pOVar14 + 0xa8),a.mBuffer[_optind],ok_00);
          std::vector<Value,_std::allocator<Value>_>::push_back
                    (&vals.super_vector<Value,_std::allocator<Value>_>,&local_1490);
          Value::~Value(&local_1490);
          if (ok == false) {
            pcVar15 = a.mBuffer[_optind];
            pcVar12 = Value::typeToString(*(Type *)(pOVar14 + 0xa8));
            String::format<128ul>
                      ((String *)&local_1490,"\"%s\" can not be converted to \"%s\" for %s",pcVar15,
                       pcVar12,*(long *)(pOVar14 + 8));
            goto LAB_0016234e;
          }
          _optind = _optind + 1;
        }
        Value::Value(&local_1490,(List<Value> *)&vals.super_vector<Value,_std::allocator<Value>_>);
        Value::operator=((Value *)(pOVar14 + 0x70),&local_1490);
        Value::~Value(&local_1490);
        lVar13 = *(long *)(pOVar14 + 0xb8);
        iVar7 = 0;
        bVar6 = true;
        if ((lVar13 != 0) &&
           (lVar11 = ((long)vals.super_vector<Value,_std::allocator<Value>_>.
                            super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)vals.super_vector<Value,_std::allocator<Value>_>.
                           super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x38, lVar11 != lVar13)) {
          ok = false;
          String::format<128ul>
                    ((String *)&local_1490,"Too few values specified for %s. Wanted %zu, got %zu",
                     *(long *)(pOVar14 + 8),lVar13,lVar11);
LAB_0016234e:
          std::__cxx11::string::operator=((string *)&error,(string *)&local_1490);
          std::__cxx11::string::~string((string *)&local_1490);
          bVar6 = false;
          iVar7 = 0x15;
        }
        std::vector<Value,_std::allocator<Value>_>::~vector
                  (&vals.super_vector<Value,_std::allocator<Value>_>);
        if (bVar6) goto LAB_00162385;
      }
      else {
        Value::operator=((Value *)(pOVar14 + 0x70),(Value *)&split);
LAB_00162385:
        cVar5 = (**(code **)(*(long *)pOVar14 + 0x10))(pOVar14,&error);
        iVar7 = 0;
        if (cVar5 == '\0') {
          ok = false;
          goto LAB_001623a3;
        }
      }
      Value::~Value((Value *)&split);
      if (iVar7 == 0) goto LAB_001623b6;
    }
  } while (iVar7 == 0);
  if (iVar7 == 0x15) {
LAB_00162422:
    while (uVar16 = (ulong)_optind,
          uVar16 < (ulong)((long)args.super_vector<String,_std::allocator<String>_>.
                                 super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)args.super_vector<String,_std::allocator<String>_>.
                                 super__Vector_base<String,_std::allocator<String>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 5)) {
      _optind = _optind + 1;
      Value::Value((Value *)&split,a.mBuffer[uVar16],-1);
      std::vector<Value,_std::allocator<Value>_>::push_back
                (&sFreeArgs.super_vector<Value,_std::allocator<Value>_>,(value_type *)&split);
      Value::~Value((Value *)&split);
    }
    if ((sAllowsFreeArgs != true) &&
       (sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
        super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_start
        != sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
           super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
           _M_finish)) {
      String::format<128ul>((String *)&split,"Unexpected free args");
      std::__cxx11::string::operator=((string *)&error,(string *)&split);
      std::__cxx11::string::~string((string *)&split);
      ok = false;
    }
    lVar13 = 0;
    for (uVar16 = 0;
        uVar16 < (ulong)((long)args.super_vector<String,_std::allocator<String>_>.
                               super__Vector_base<String,_std::allocator<String>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)args.super_vector<String,_std::allocator<String>_>.
                               super__Vector_base<String,_std::allocator<String>_>._M_impl.
                               super__Vector_impl_data._M_start >> 5); uVar16 = uVar16 + 1) {
      free(*(void **)((long)a.mBuffer + (lVar13 >> 0x1d)));
      lVar13 = lVar13 + 0x100000000;
    }
    ok_00 = (bool *)(ulong)ok;
    if ((ok == false) && (error.mString._M_string_length != 0)) {
      showHelp((FILE *)_stderr);
      fprintf(_stderr,"%s\n",error.mString._M_dataplus._M_p);
      ok_00 = (bool *)(ulong)ok;
    }
  }
  std::__cxx11::string::~string((string *)&shortOpts);
  std::_Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>::~_Vector_base
            ((_Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_> *)
             &optionPointers);
  StackBuffer<128UL,_option>::~StackBuffer(&options);
  StackBuffer<128UL,_char_*>::~StackBuffer(&a);
  std::vector<String,_std::allocator<String>_>::~vector
            (&args.super_vector<String,_std::allocator<String>_>);
  std::__cxx11::string::~string((string *)&error);
  return (bool)((byte)ok_00 & 1);
}

Assistant:

bool Config::parse(int argc, char **argv, const List<Path> &rcFiles)
{
    String error;
    Rct::findExecutablePath(argv[0]);
    List<String> args;
    args << argv[0];
    for (size_t i=0; i<rcFiles.size(); ++i) {
        FILE *f = fopen(rcFiles.at(i).constData(), "r");
        if (f) {
            char line[1024];
            int read;
            while ((read = Rct::readLine(f, line, sizeof(line))) != -1) {
                char *ch = line;
                while (isspace(*ch))
                    ++ch;
                if (*ch == '#')
                    continue;
                List<String> split = String(ch).split(' '); // ### quoting?
                if (!split.isEmpty()) {
                    String &first = split.first();
                    if (first.size() == 1 || (first.size() > 2 && first.at(1) == '=')) {
                        first.prepend('-');
                    } else {
                        first.prepend("--");
                    }
                    args += split;
                }
            }
            fclose(f);
        }
    }
    for (int i=1; i<argc; ++i)
        args.append(argv[i]);

    // ::error() << "parsing" << args;

    StackBuffer<128, char *> a(args.size());
    for (size_t i=0; i<args.size(); ++i) {
        a[i] = strdup(args.at(i).constData());
    }
    StackBuffer<128, option> options(sOptions.size() + 1);

    List<OptionBase*> optionPointers;
    for (size_t i=0; i<sOptions.size(); ++i) {
        OptionBase *opt = sOptions.at(i);
        if (opt->name) {
            option &o = options[optionPointers.size()];
            optionPointers.append(opt);
            o.name = opt->name;
            o.has_arg = (opt->defaultValue.type() == Value::Type_Boolean) ? no_argument : required_argument; // ### no optional arg?
            o.val = opt->shortOption;
            o.flag = 0;
        }
    }
    memset(&options[optionPointers.size()], 0, sizeof(option));
    const String shortOpts = Rct::shortOptions(options);

    bool ok = true;

    while (true) {
        int idx = -1;
        const int ret = getopt_long(args.size(), a, shortOpts.constData(), options, &idx);
        switch (ret) {
        case -1:
            goto done;
        case '?':
            ok = false;
            goto done;
        default:
            break;
        }
        // error() << optind << ret << optarg;
        // error("%c [%s] [%s]", ret, optarg, a[optind]);

        OptionBase *opt = 0;
        if (idx != -1) {
            opt = optionPointers[idx];
        } else {
            for (size_t i=0; i<optionPointers.size(); ++i) {
                if (optionPointers[i]->shortOption == ret) {
                    opt = optionPointers[i];
                    break;
                }
            }
        }
        if (!opt) {
            ok = false;
            goto done;
        }
        ++opt->count;
        if (optarg) {
            Value val;
            const char *arg = optarg;
            if (optarg[0] == '=' && strcmp(a[optind - 1], optarg)) {
                ++arg;
            }
            val = createValue(opt->type, arg, &ok);
            if (!ok) {
                error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                            arg, Value::typeToString(opt->type),
                                            opt->name);
                goto done;
            }

            if (opt->defaultValue.type() == Value::Type_List) {
                List<Value> vals;
                vals << val;
                while (static_cast<size_t>(optind) < args.size() && a[optind][0] != '-' && (!opt->listCount || vals.size() < opt->listCount)) {
                    vals << createValue(opt->type, a[optind], &ok);
                    if (!ok) {
                        error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                                    a[optind], Value::typeToString(opt->type),
                                                    opt->name);
                        goto done;
                    }
                    ++optind;
                }
                opt->value = vals;
                if (opt->listCount && vals.size() != opt->listCount) {
                    ok = false;
#ifdef _WIN32
                    error = String::format<128>("Too few values specified for %s. Wanted %Iu, got %Iu",
#else
                    error = String::format<128>("Too few values specified for %s. Wanted %zu, got %zu",
#endif

                                                opt->name, opt->listCount, vals.size());

                    goto done;
                }
            } else {
                opt->value = val;
            }
            if (!opt->validate(error)) {
                ok = false;
                goto done;
            }
        } else {
            assert(opt->defaultValue.type() == Value::Type_Boolean);
            // must be a toggle arg
            opt->value = Value(!opt->defaultValue.toBool());
        }
    }

done:
    while (static_cast<size_t>(optind) < args.size()) {
        sFreeArgs << a[optind++];
    }
    if (!sAllowsFreeArgs && !sFreeArgs.isEmpty()) {
        error = String::format<128>("Unexpected free args");
        ok = false;
    }

    for (size_t i=0; i<args.size(); ++i) {
        free(a[i]);
    }

    if (!ok) {
        if (!error.isEmpty()) {
            showHelp(stderr);
            fprintf(stderr, "%s\n", error.constData());
        }
    }
    return ok;
}